

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

Options * google::protobuf::Arena::CreateMaybeMessage<bloaty::Options>(Arena *arena)

{
  type_info *in_RDI;
  size_t n;
  size_t in_stack_ffffffffffffff90;
  Arena *in_stack_ffffffffffffffa0;
  type_info *n_00;
  ArenaImpl *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar1;
  
  if (in_RDI == (type_info *)0x0) {
    local_38 = (Options *)operator_new(0xe0);
    bloaty::Options::Options
              ((Options *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  }
  else {
    uVar1 = 0;
    n_00 = in_RDI;
    internal::AlignUpTo8(0xe0);
    AllocHook(in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff90);
    local_38 = (Options *)
               internal::ArenaImpl::AllocateAlignedAndAddCleanup
                         (in_stack_ffffffffffffffb0,(size_t)n_00,
                          (_func_void_void_ptr *)in_stack_ffffffffffffffa0);
    bloaty::Options::Options((Options *)CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  }
  return local_38;
}

Assistant:

PROTOBUF_NAMESPACE_OPEN
template<> PROTOBUF_NOINLINE ::bloaty::Options* Arena::CreateMaybeMessage< ::bloaty::Options >(Arena* arena) {
  return Arena::CreateInternal< ::bloaty::Options >(arena);
}